

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_cast.c
# Opt level: O1

int l2_cast_octal_str_to_int(char *s)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  char cVar5;
  int iVar6;
  
  l2_assert_func((long)s,L2_INTERNAL_ERROR_NULL_POINTER,"l2_cast_octal_str_to_int",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_parser/l2_cast.c"
                 ,0x1e);
  cVar5 = *s;
  if (cVar5 == '\0') {
    iVar1 = 0;
  }
  else {
    sVar2 = strlen(s);
    iVar1 = 0;
    do {
      iVar4 = 1;
      iVar3 = (int)sVar2;
      if (1 < iVar3) {
        iVar6 = 1;
        do {
          iVar4 = iVar4 << 3;
          iVar6 = iVar6 + 1;
        } while (iVar3 != iVar6);
      }
      sVar2 = (size_t)(iVar3 - 1);
      iVar1 = iVar1 + (cVar5 + -0x30) * iVar4;
      cVar5 = s[1];
      s = s + 1;
    } while (cVar5 != '\0');
  }
  return iVar1;
}

Assistant:

int l2_cast_octal_str_to_int(const char *s) {
    l2_assert(s, L2_INTERNAL_ERROR_NULL_POINTER);
    const char *p;
    int ans = 0, n = strlen(s), factor;
    for (p = s; *p != '\0'; p++) {
        l2_pow(factor, 8, n - 1);
        ans += factor * (*p - '0');
        n -= 1;
    }
    return ans;
}